

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

unsigned_long __thiscall MockNamedValue::getUnsignedLongIntValue(MockNamedValue *this)

{
  bool bVar1;
  bool bVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  MockNamedValue *local_18;
  MockNamedValue *this_local;
  
  local_18 = this;
  SimpleString::SimpleString(&local_28,"unsigned int");
  bVar1 = operator==(&this->type_,&local_28);
  SimpleString::~SimpleString(&local_28);
  if (bVar1) {
    this_local = (MockNamedValue *)(ulong)(this->value_).unsignedIntValue_;
  }
  else {
    SimpleString::SimpleString(local_48,"int");
    bVar2 = operator==(&this->type_,local_48);
    bVar1 = false;
    if (bVar2) {
      bVar1 = -1 < (this->value_).intValue_;
    }
    SimpleString::~SimpleString(local_48);
    if (bVar1) {
      this_local = (MockNamedValue *)(long)(this->value_).intValue_;
    }
    else {
      SimpleString::SimpleString(&local_58,"long int");
      bVar2 = operator==(&this->type_,&local_58);
      bVar1 = false;
      if (bVar2) {
        bVar1 = -1 < (this->value_).longIntValue_;
      }
      SimpleString::~SimpleString(&local_58);
      if (bVar1) {
        this_local = (MockNamedValue *)(this->value_).stringValue_;
      }
      else {
        pUVar3 = UtestShell::getCurrent();
        pcVar4 = SimpleString::asCharString(&this->type_);
        pTVar5 = UtestShell::getCurrentTestTerminator();
        (*pUVar3->_vptr_UtestShell[9])
                  (pUVar3,"unsigned long int",pcVar4,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                   ,0xf4,pTVar5);
        this_local = (MockNamedValue *)(this->value_).stringValue_;
      }
    }
  }
  return (unsigned_long)this_local;
}

Assistant:

unsigned long int MockNamedValue::getUnsignedLongIntValue() const
{
    if(type_ == "unsigned int")
        return value_.unsignedIntValue_;
    else if(type_ == "int" && value_.intValue_ >= 0)
        return (unsigned long int)value_.intValue_;
    else if(type_ == "long int" && value_.longIntValue_ >= 0)
        return (unsigned long int)value_.longIntValue_;
    else
    {
        STRCMP_EQUAL("unsigned long int", type_.asCharString());
        return value_.unsignedLongIntValue_;
    }
}